

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fnv.hpp
# Opt level: O0

uint64_t __thiscall
pstore::fnv_64a_hash::operator()(fnv_64a_hash *this,sstring_view<const_char_*> *c)

{
  uint64_t uVar1;
  uint64_t in_RCX;
  span<const_char,__1L> sVar2;
  undefined8 local_28;
  undefined8 local_20;
  sstring_view<const_char_*> *c_local;
  fnv_64a_hash *this_local;
  
  sVar2 = gsl::make_span<pstore::sstring_view<char_const*>>(c);
  local_28 = sVar2.storage_.super_extent_type<_1L>.size_;
  local_20 = (index_type)sVar2.storage_.data_;
  sVar2.storage_.data_ = (pointer)0xcbf29ce484222325;
  sVar2.storage_.super_extent_type<_1L>.size_ = local_20;
  uVar1 = fnv_64a_buf<char_const,_1l>((pstore *)local_28,sVar2,in_RCX);
  return uVar1;
}

Assistant:

std::uint64_t operator() (Container const & c) const {
            return fnv_64a_buf (gsl::make_span (c));
        }